

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smemory.c
# Opt level: O3

int_t smemory_usage(int_t nzlmax,int_t nzumax,int_t nzlumax,int n)

{
  return nzumax * 8 + n * 0x28 + (nzlmax + nzlumax) * 4;
}

Assistant:

int_t smemory_usage(const int_t nzlmax, const int_t nzumax,
		  const int_t nzlumax, const int n)
{
    register int iword, liword, dword;

    iword   = sizeof(int);
    liword  = sizeof(int_t);
    dword   = sizeof(float);
    
    return (10 * n * iword +
	    nzlmax * liword + nzumax * (liword + dword) + nzlumax * dword);

}